

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::Load(SentencePieceProcessor *this,ModelProto *model_proto)

{
  long *in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  __single_object model_proto_copy;
  ModelProto *in_stack_ffffffffffffff88;
  ModelProto *in_stack_ffffffffffffff90;
  unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_> *this_00;
  unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
  local_38 [7];
  
  std::make_unique<sentencepiece::ModelProto>();
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  operator*((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
             *)in_stack_ffffffffffffff90);
  ModelProto::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = local_38;
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  unique_ptr(this_00,(unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                      *)in_stack_ffffffffffffff88);
  (**(code **)(*in_RSI + 0x28))
            (in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl,in_RSI,
             this_00);
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr(this_00);
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr(this_00);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceProcessor::Load(const ModelProto &model_proto) {
  auto model_proto_copy = std::make_unique<ModelProto>();
  *model_proto_copy = model_proto;
  return Load(std::move(model_proto_copy));
}